

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowcontainer.cpp
# Opt level: O1

void QWindowContainer::parentWasChanged(QWidget *parent)

{
  QWidgetPrivate *this;
  Data *pDVar1;
  long lVar2;
  QWidget *this_00;
  QWindow *pQVar3;
  QObject *pQVar4;
  QWindowContainerPrivate *this_01;
  
  lVar2 = QMetaObject::cast((QObject *)&staticMetaObject);
  if (lVar2 == 0) {
    this_01 = (QWindowContainerPrivate *)0x0;
  }
  else {
    this_01 = *(QWindowContainerPrivate **)(lVar2 + 8);
  }
  if (this_01 != (QWindowContainerPrivate *)0x0) {
    lVar2 = QWindow::parent((this_01->window).wp.value,0);
    if (lVar2 != 0) {
      QWindowContainerPrivate::updateUsesNativeWidgets(this_01);
      QWindowContainerPrivate::markParentChain(this_01);
      this_00 = parent;
      if ((this_01->field_0x290 & 1) == 0) {
        this_00 = QWidget::window(parent);
      }
      pQVar3 = QWidget::windowHandle(this_00);
      if (pQVar3 == (QWindow *)0x0) {
        this = *(QWidgetPrivate **)&this_00->field_0x8;
        QWidgetPrivate::createTLExtra(this);
        QWidgetPrivate::createTLSysExtra(this);
      }
      pQVar3 = (QWindow *)0x0;
      pQVar4 = (QObject *)QWindow::parent((this_01->window).wp.value,0);
      QObject::removeEventFilter(pQVar4);
      pDVar1 = (this_01->window).wp.d;
      if (pDVar1 != (Data *)0x0) {
        if (*(int *)(pDVar1 + 4) == 0) {
          pQVar3 = (QWindow *)0x0;
        }
        else {
          pQVar3 = (QWindow *)(this_01->window).wp.value;
        }
      }
      QWidget::windowHandle(this_00);
      QWindow::setParent(pQVar3);
      pQVar3 = QWidget::windowHandle(this_00);
      QObject::installEventFilter((QObject *)pQVar3);
      QWindow::destroy();
      QWindowContainerPrivate::updateGeometry(this_01);
    }
  }
  qwindowcontainer_traverse(parent,parentWasChanged);
  return;
}

Assistant:

void QWindowContainer::parentWasChanged(QWidget *parent)
{
    if (QWindowContainerPrivate *d = QWindowContainerPrivate::get(parent)) {
        if (d->window->parent()) {
            d->updateUsesNativeWidgets();
            d->markParentChain();
            QWidget *toplevel = d->usesNativeWidgets ? parent : parent->window();
            if (!toplevel->windowHandle()) {
                QWidgetPrivate *tld = static_cast<QWidgetPrivate *>(QWidgetPrivate::get(toplevel));
                tld->createTLExtra();
                tld->createTLSysExtra();
                Q_ASSERT(toplevel->windowHandle());
            }
            d->window->parent()->removeEventFilter(parent);
            d->window->setParent(toplevel->windowHandle());
            toplevel->windowHandle()->installEventFilter(parent);
            d->fakeParent.destroy();
            d->updateGeometry();
        }
    }
    qwindowcontainer_traverse(parent, parentWasChanged);
}